

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

void duckdb_re2::FactorAlternationImpl::Round3
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<duckdb_re2::Splice,_std::allocator<duckdb_re2::Splice>_> *splices)

{
  Regexp *pRVar1;
  ostream *poVar2;
  CharClass *pCVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Rune *pRVar7;
  ulong uVar8;
  CharClassBuilder ccb;
  Regexp *re;
  int local_244;
  ulong local_240;
  undefined1 local_238 [32];
  ulong local_218;
  ulong local_210;
  vector<duckdb_re2::Splice,std::allocator<duckdb_re2::Splice>> *local_208;
  Regexp *local_200;
  ulong local_1f8;
  CharClassBuilder local_1f0;
  Regexp *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (-1 < nsub) {
    uVar4 = (ulong)(uint)nsub;
    uVar6 = (ulong)(nsub + 1);
    uVar8 = 0;
    uVar5 = 0;
    local_200 = (Regexp *)0x0;
    local_218 = uVar4;
    local_210 = uVar6;
    local_208 = (vector<duckdb_re2::Splice,std::allocator<duckdb_re2::Splice>> *)splices;
    do {
      pRVar1 = local_200;
      if ((((uVar4 <= uVar8) || (pRVar1 = sub[uVar8], local_200 == (Regexp *)0x0)) ||
          ((local_200->op_ != '\x14' && (local_200->op_ != '\x03')))) ||
         ((pRVar1->op_ != '\x03' && (pRVar1->op_ != '\x14')))) {
        local_200 = pRVar1;
        if (uVar8 != (int)uVar5 + 1 && uVar8 != uVar5) {
          CharClassBuilder::CharClassBuilder(&local_1f0);
          uVar4 = (ulong)(int)uVar5;
          local_240 = uVar4;
          local_1f8 = uVar5;
          if ((long)uVar4 < (long)uVar8) {
            do {
              pRVar1 = sub[uVar4];
              if (pRVar1->op_ == '\x03') {
                CharClassBuilder::AddRangeFlags
                          (&local_1f0,(pRVar1->arguments).rune_,(pRVar1->arguments).rune_,
                           (uint)pRVar1->parse_flags_);
              }
              else if (pRVar1->op_ == '\x14') {
                pCVar3 = (pRVar1->arguments).char_class.cc_;
                if (*(int *)(pCVar3 + 0x10) != 0) {
                  pRVar7 = *(Rune **)(pCVar3 + 8);
                  do {
                    CharClassBuilder::AddRange(&local_1f0,*pRVar7,pRVar7[1]);
                    pRVar7 = pRVar7 + 2;
                  } while (pRVar7 != (Rune *)((long)*(int *)(pCVar3 + 0x10) * 8 +
                                             *(long *)(pCVar3 + 8)));
                }
              }
              else {
                local_1b0 = (Regexp *)((ulong)local_1b0 & 0xffffffffffffff00);
                std::__cxx11::ostringstream::ostringstream(local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"RE2: unexpected op: ",0x14);
                poVar2 = (ostream *)std::ostream::operator<<(local_1a8,(uint)pRVar1->op_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
                Regexp::ToString_abi_cxx11_((string *)local_238,pRVar1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar2,(char *)local_238._0_8_,local_238._8_8_);
                if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
                  operator_delete((void *)local_238._0_8_);
                }
                std::__cxx11::ostringstream::~ostringstream(local_1a8);
                std::ios_base::~ios_base(local_138);
              }
              Regexp::Decref(pRVar1);
              uVar4 = uVar4 + 1;
            } while ((uVar4 & 0xffffffff) != uVar8);
          }
          pCVar3 = CharClassBuilder::GetCharClass(&local_1f0);
          local_1b0 = Regexp::NewCharClass(pCVar3,flags);
          uVar5 = local_1f8;
          local_238._0_8_ = sub + local_240;
          local_244 = (int)uVar8 - (int)local_1f8;
          std::vector<duckdb_re2::Splice,std::allocator<duckdb_re2::Splice>>::
          emplace_back<duckdb_re2::Regexp*&,duckdb_re2::Regexp**,int>
                    (local_208,&local_1b0,(Regexp ***)local_238,&local_244);
          std::
          _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
          ::~_Rb_tree(&local_1f0.ranges_._M_t);
          uVar4 = local_218;
          uVar6 = local_210;
        }
        uVar5 = uVar5 & 0xffffffff;
        if (uVar8 < uVar4) {
          uVar5 = uVar8 & 0xffffffff;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  return;
}

Assistant:

void FactorAlternationImpl::Round3(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 3: Merge runs of literals and/or character classes.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // are either literals (i.e. runes) or character classes.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = sub[i];
      if (first != NULL &&
          (first->op() == kRegexpLiteral ||
           first->op() == kRegexpCharClass) &&
          (first_i->op() == kRegexpLiteral ||
           first_i->op() == kRegexpCharClass))
        continue;
    }

    // Found end of a run of Literal/CharClass:
    // sub[start:i] all are either one or the other,
    // but sub[i] is not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      Regexp* re = Regexp::NewCharClass(ccb.GetCharClass(), flags);
      splices->emplace_back(re, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}